

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

void __thiscall ON_Layer::SetPersistentLocking(ON_Layer *this,bool bLockedChild)

{
  bool bVar1;
  byte bVar2;
  uchar or_bit;
  uchar and_mask;
  bool bLockedChild_local;
  ON_Layer *this_local;
  
  bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
  if (bVar1) {
    bVar2 = 0x10;
    if (bLockedChild) {
      bVar2 = 8;
    }
  }
  else {
    bVar2 = 0;
  }
  this->m_extension_bits = this->m_extension_bits & 0xe7;
  this->m_extension_bits = this->m_extension_bits | bVar2;
  return;
}

Assistant:

void ON_Layer::SetPersistentLocking(bool bLockedChild)
{
  const unsigned char and_mask = 0xE7;
  const unsigned char or_bit = ParentIdIsNotNil()
                             ? (bLockedChild ? 0x08 : 0x10)
                             : 0x00;
  m_extension_bits &= and_mask;
  m_extension_bits |= or_bit;
}